

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O2

void lore_append_drop(textblock *tb,monster_race *race,monster_lore *lore,bitflag *known_flags)

{
  _Bool _Var1;
  _Bool _Var2;
  _Bool _Var3;
  uint in_EAX;
  monster_sex_t mVar4;
  wchar_t wVar5;
  char *pcVar6;
  char *fmt;
  wchar_t pronoun_index;
  ulong uStack_38;
  wchar_t nspec;
  
  uStack_38 = (ulong)in_EAX;
  if (((tb == (textblock *)0x0) || (race == (monster_race *)0x0)) || (lore == (monster_lore *)0x0))
  {
    __assert_fail("tb && race && lore",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/mon-lore.c"
                  ,0x4a0,
                  "void lore_append_drop(textblock *, const struct monster_race *, const struct monster_lore *, bitflag *)"
                 );
  }
  if (lore->drop_known != true) {
    return;
  }
  mVar4 = lore_monster_sex(race);
  wVar5 = mon_create_drop_count(race,true,false,&nspec);
  if ((wVar5 < L'\x01') && (nspec < L'\x01')) {
    return;
  }
  textblock_append(tb,"%s may carry",
                   *(undefined8 *)(lore_pronoun_nominative_lore_pronouns + (ulong)mVar4 * 0x10 + 8))
  ;
  if (wVar5 < L'\x01') {
    if (nspec < L'\x01') goto LAB_00167296;
  }
  else {
    _Var1 = flag_has_dbg(known_flags,0xb,0x1e,"known_flags","RF_ONLY_ITEM");
    _Var2 = flag_has_dbg(known_flags,0xb,0x1d,"known_flags","RF_ONLY_GOLD");
    if (wVar5 == L'\x01') {
      pcVar6 = " a single ";
LAB_001670c4:
      textblock_append_c(tb,'\x06',pcVar6);
    }
    else {
      if (wVar5 == L'\x02') {
        pcVar6 = " one or two ";
        goto LAB_001670c4;
      }
      textblock_append(tb," up to ");
      textblock_append_c(tb,'\x06',"%d ",(ulong)(uint)wVar5);
    }
    _Var3 = flag_has_dbg(known_flags,0xb,0x26,"known_flags","RF_DROP_GREAT");
    if (_Var3) {
      pcVar6 = "exceptional ";
LAB_0016714a:
      textblock_append_c(tb,'\x06',pcVar6);
    }
    else {
      _Var3 = flag_has_dbg(known_flags,0xb,0x25,"known_flags","RF_DROP_GOOD");
      if (_Var3) {
        pcVar6 = "good ";
        goto LAB_0016714a;
      }
    }
    if (_Var1 && _Var2) {
      pcVar6 = "s";
      if (wVar5 == L'\x01') {
        pcVar6 = "";
      }
      fmt = "error%s";
LAB_0016720d:
      textblock_append_c(tb,'\x06',fmt,pcVar6);
    }
    else {
      if (_Var1 && !_Var2) {
        pcVar6 = "s";
        if (wVar5 == L'\x01') {
          pcVar6 = "";
        }
        fmt = "object%s";
        goto LAB_0016720d;
      }
      if (_Var2 && !_Var1) {
        pcVar6 = "s";
        if (wVar5 == L'\x01') {
          pcVar6 = "";
        }
        fmt = "treasure%s";
        goto LAB_0016720d;
      }
      if (!_Var1 && !_Var2) {
        pcVar6 = "s";
        if (wVar5 == L'\x01') {
          pcVar6 = "";
        }
        textblock_append_c(tb,'\x06',"object%s or treasure%s",pcVar6,pcVar6);
      }
    }
    if (nspec < L'\x01') goto LAB_00167296;
    textblock_append(tb," and");
  }
  if (nspec == L'\x02') {
    pcVar6 = " one or two";
LAB_00167250:
    textblock_append(tb,pcVar6);
  }
  else {
    if (nspec == L'\x01') {
      pcVar6 = " a single";
      goto LAB_00167250;
    }
    textblock_append(tb," up to");
    textblock_append_c(tb,'\x06'," %d",uStack_38 >> 0x20);
  }
  textblock_append(tb," specific items");
LAB_00167296:
  textblock_append(tb,".  ");
  return;
}

Assistant:

void lore_append_drop(textblock *tb, const struct monster_race *race,
					  const struct monster_lore *lore,
					  bitflag known_flags[RF_SIZE])
{
	int n = 0, nspec = 0;
	monster_sex_t msex = MON_SEX_NEUTER;

	assert(tb && race && lore);
	if (!lore->drop_known) return;

	/* Extract a gender (if applicable) */
	msex = lore_monster_sex(race);

	/* Count maximum drop */
	n = mon_create_drop_count(race, true, false, &nspec);

	/* Drops gold and/or items */
	if (n > 0 || nspec > 0) {
		textblock_append(tb, "%s may carry",
			lore_pronoun_nominative(msex, true));

		/* Report general drops */
		if (n > 0) {
			bool only_item = rf_has(known_flags, RF_ONLY_ITEM);
			bool only_gold = rf_has(known_flags, RF_ONLY_GOLD);

			if (n == 1) {
				textblock_append_c(tb, COLOUR_BLUE,
					" a single ");
			} else if (n == 2) {
				textblock_append_c(tb, COLOUR_BLUE,
					" one or two ");
			} else {
				textblock_append(tb, " up to ");
				textblock_append_c(tb, COLOUR_BLUE, "%d ", n);
			}

			/* Quality */
			if (rf_has(known_flags, RF_DROP_GREAT)) {
				textblock_append_c(tb, COLOUR_BLUE,
					"exceptional ");
			} else if (rf_has(known_flags, RF_DROP_GOOD)) {
				textblock_append_c(tb, COLOUR_BLUE, "good ");
			}

			/* Objects or treasures */
			if (only_item && only_gold) {
				textblock_append_c(tb, COLOUR_BLUE,
					"error%s", PLURAL(n));
			} else if (only_item && !only_gold) {
				textblock_append_c(tb, COLOUR_BLUE,
					"object%s", PLURAL(n));
			} else if (!only_item && only_gold) {
				textblock_append_c(tb, COLOUR_BLUE,
					"treasure%s", PLURAL(n));
			} else if (!only_item && !only_gold) {
				textblock_append_c(tb, COLOUR_BLUE,
					"object%s or treasure%s",
					PLURAL(n), PLURAL(n));
			}
		}

		/*
		 * Report specific drops (just maximum number, no types,
		 * does not include quest artifacts).
		 */
		if (nspec > 0) {
			if (n > 0) {
				textblock_append(tb, " and");
			}
			if (nspec == 1) {
				textblock_append(tb, " a single");
			} else if (nspec == 2) {
				textblock_append(tb, " one or two");
			} else {
				textblock_append(tb, " up to");
				textblock_append_c(tb, COLOUR_BLUE, " %d",
					nspec);
			}
			textblock_append(tb, " specific items");
		}

		textblock_append(tb, ".  ");
	}
}